

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

void make_edges(chunk_conflict *c,_Bool ragged,_Bool valley)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc_conflict grid_07;
  loc_conflict grid_08;
  loc_conflict grid_09;
  loc_conflict grid_10;
  loc_conflict grid_11;
  loc_conflict grid_12;
  loc_conflict grid_13;
  loc_conflict grid_14;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t local_44;
  wchar_t local_34;
  wchar_t wStack_30;
  loc grid;
  wchar_t path_x [3];
  wchar_t num;
  wchar_t j;
  wchar_t i;
  _Bool valley_local;
  _Bool ragged_local;
  chunk_conflict *c_local;
  
  uVar2 = Rand_div(2);
  wVar3 = uVar2 + L'\x02';
  for (num = L'\0'; num < wVar3; num = num + L'\x01') {
    uVar2 = Rand_div((c->width + -0x14) / wVar3 - 2);
    path_x[(long)num + -2] = uVar2 + 10 + (num * (c->width + -0x14)) / wVar3;
  }
  num = L'\x04';
  if (valley) {
    num = L'\x05';
  }
  for (local_34 = L'\0'; local_34 < c->width; local_34 = local_34 + L'\x01') {
    if (ragged) {
      uVar2 = Rand_div(3);
      num = (1 - uVar2) + num;
      wVar4 = L'\a';
      if (valley) {
        wVar4 = L'\n';
      }
      if ((wVar4 < num) && (num = L'\a', valley)) {
        num = L'\n';
      }
      if (num < L'\x01') {
        num = L'\x01';
      }
      for (wStack_30 = L'\0'; wStack_30 < num; wStack_30 = wStack_30 + L'\x01') {
        grid_00.y = wStack_30;
        grid_00.x = local_34;
        _Var1 = square_ismark((chunk *)c,grid_00);
        if (!_Var1) {
          grid_01.y = wStack_30;
          grid_01.x = local_34;
          square_set_feat((chunk *)c,grid_01,FEAT_PERM);
        }
      }
      if (((valley) && (L'\0' < local_34)) && (local_34 == player->upkeep->path_coord)) {
        if (wStack_30 == L'\0') {
          wStack_30 = L'\x01';
        }
        grid_02.y = wStack_30;
        grid_02.x = local_34;
        square_set_feat((chunk *)c,grid_02,FEAT_PASS_RUBBLE);
        grid_03.y = wStack_30;
        grid_03.x = local_34;
        player_place((chunk_conflict1 *)c,player,grid_03);
      }
    }
    else {
      grid_04.y = L'\0';
      grid_04.x = local_34;
      square_set_feat((chunk *)c,grid_04,FEAT_PERM);
    }
  }
  num = L'\x04';
  if (valley) {
    num = L'\x05';
  }
  path_x[2] = L'\0';
  for (local_34 = L'\0'; local_34 < c->width; local_34 = local_34 + L'\x01') {
    if ((!ragged) || ((valley && (player->depth == 0x46)))) {
      grid_09.y = c->height + L'\xffffffff';
      grid_09.x = local_34;
      square_set_feat((chunk *)c,grid_09,FEAT_PERM);
    }
    else {
      uVar2 = Rand_div(3);
      num = (1 - uVar2) + num;
      wVar4 = L'\a';
      if (valley) {
        wVar4 = L'\n';
      }
      if ((wVar4 < num) && (num = L'\a', valley)) {
        num = L'\n';
      }
      if (num < L'\x01') {
        num = L'\x01';
      }
      wStack_30 = c->height;
      while (wStack_30 = wStack_30 + L'\xffffffff', (c->height + -1) - num < wStack_30) {
        grid_05.y = wStack_30;
        grid_05.x = local_34;
        _Var1 = square_ismark((chunk *)c,grid_05);
        if (!_Var1) {
          if ((valley) && (wStack_30 != c->height + L'\xffffffff')) {
            local_44 = FEAT_VOID;
          }
          else {
            local_44 = FEAT_PERM;
          }
          grid_06.y = wStack_30;
          grid_06.x = local_34;
          square_set_feat((chunk *)c,grid_06,local_44);
        }
      }
      if (((path_x[2] < wVar3) && (valley)) && (local_34 == path_x[(long)path_x[2] + -2])) {
        grid_07.y = wStack_30;
        grid_07.x = local_34;
        square_set_feat((chunk *)c,grid_07,FEAT_MORE_SOUTH);
        grid_08.y = wStack_30;
        grid_08.x = local_34;
        square_mark((chunk *)c,grid_08);
        path_x[2] = path_x[2] + L'\x01';
      }
    }
  }
  num = L'\x05';
  for (wStack_30 = L'\0'; wStack_30 < c->height; wStack_30 = wStack_30 + L'\x01') {
    if (ragged) {
      uVar2 = Rand_div(3);
      num = (1 - uVar2) + num;
      if (L'\n' < num) {
        num = L'\n';
      }
      if (num < L'\x01') {
        num = L'\x01';
      }
      for (local_34 = L'\0'; local_34 < num; local_34 = local_34 + L'\x01') {
        grid_10.y = wStack_30;
        grid_10.x = local_34;
        _Var1 = square_ismark((chunk *)c,grid_10);
        if (!_Var1) {
          grid_11.y = wStack_30;
          grid_11.x = local_34;
          square_set_feat((chunk *)c,grid_11,FEAT_PERM);
        }
      }
    }
    else {
      square_set_feat((chunk *)c,(loc_conflict)((ulong)(uint)wStack_30 << 0x20),FEAT_PERM);
    }
  }
  num = L'\x05';
  for (wStack_30 = L'\0'; wStack_30 < c->height; wStack_30 = wStack_30 + L'\x01') {
    if (ragged) {
      uVar2 = Rand_div(3);
      num = (1 - uVar2) + num;
      if (L'\n' < num) {
        num = L'\n';
      }
      if (num < L'\x01') {
        num = L'\x01';
      }
      local_34 = c->width;
      while (local_34 = local_34 + L'\xffffffff', (c->width + -1) - num < local_34) {
        grid_12.y = wStack_30;
        grid_12.x = local_34;
        _Var1 = square_ismark((chunk *)c,grid_12);
        if (!_Var1) {
          grid_13.y = wStack_30;
          grid_13.x = local_34;
          square_set_feat((chunk *)c,grid_13,FEAT_PERM);
        }
      }
    }
    else {
      grid_14.y = wStack_30;
      grid_14.x = c->width + L'\xffffffff';
      square_set_feat((chunk *)c,grid_14,FEAT_PERM);
    }
  }
  return;
}

Assistant:

static void make_edges(struct chunk *c, bool ragged, bool valley)
{
	int i, j, num = 2;
	int path_x[3];
	struct loc grid;

	/* Prepare places for down slides */
	num += randint0(2);
	for (i = 0; i < num; i++)
		/*
		 * Skip first and last ten columns to avoid surrounding the
		 * slide in permanent walls.  Avoid last two columns in each
		 * interval to limit the possibility of nearby slides.
		 */
		path_x[i] = 10 + randint0((c->width - 20) / num - 2)
			+ (i * (c->width - 20)) / num;

	/* Special boundary walls -- Top */
	i = (valley ? 5 : 4);
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = 0; grid.y < i; grid.y++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
			if (valley && (grid.x > 0) &&
				(grid.x == player->upkeep->path_coord)) {
				if (grid.y == 0) {
					grid.y++;
				}
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				player_place(c, player, grid);
			}
		} else {
			grid.y = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}


	/* Special boundary walls -- Bottom */
	i = (valley ? 5 : 4);
	j = 0;
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged && !(valley && (player->depth == 70))) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = c->height - 1; grid.y > c->height - 1 - i; grid.y--) {
				/* Clear previous contents, add perma-wall or void */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, (valley && grid.y != c->height - 1) ? FEAT_VOID : FEAT_PERM);
				}
			}
			/* Down slides */
			if ((j < num) && valley)
				if (grid.x == path_x[j]) {
					square_set_feat(c, grid, FEAT_MORE_SOUTH);
					/* Mark so it won't be overwritten. */
					square_mark(c, grid);
					j++;
				}
		} else {
			grid.y = c->height - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Left */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = 0; grid.x < i; grid.x++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Right */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = c->width - 1; grid.x > c->width - 1 - i; grid.x--) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = c->width - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}
}